

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

void __thiscall
ft::deque<int,_ft::allocator<int>_>::push_front
          (deque<int,_ft::allocator<int>_> *this,value_type *val)

{
  map_pointer ppvVar1;
  pointer pvVar2;
  size_t in_RDX;
  
  if ((this->m_start).m_cur == (this->m_start).m_first) {
    if ((this->m_start).m_node == this->m_map) {
      realloc(this,val,in_RDX);
    }
    if ((this->m_start).m_node[-1] == (pointer)0x0) {
      pvVar2 = (pointer)operator_new(0x100);
      (this->m_start).m_node[-1] = pvVar2;
      this->m_chunks = this->m_chunks + 1;
    }
  }
  if ((this->m_start).m_cur == (this->m_start).m_first) {
    ppvVar1 = (this->m_start).m_node;
    (this->m_start).m_node = ppvVar1 + -1;
    pvVar2 = ppvVar1[-1];
    (this->m_start).m_first = pvVar2;
    pvVar2 = pvVar2 + 0x40;
    (this->m_start).m_last = pvVar2;
    (this->m_start).m_cur = pvVar2;
  }
  pvVar2 = (this->m_start).m_cur;
  (this->m_start).m_cur = pvVar2 + -1;
  pvVar2[-1] = *val;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_front(value_type const & val) {
		if (this->m_start.m_cur == this->m_start.m_first) {
			if (this->m_start.m_node == this->m_map) {
				this->realloc();
			}
			if (*(this->m_start.m_node - 1) == NULL) {
				*(this->m_start.m_node - 1) = this->m_alloc.allocate(this->chunk_size());
				++this->m_chunks;
			}
		}
		--this->m_start;
		this->m_alloc.construct(this->m_start.m_cur, val);
		++this->m_size;
	}